

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O1

bool __thiscall de::FilePath::beginsWithDrive(FilePath *this)

{
  char cVar1;
  char cVar2;
  pointer pcVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  byte in_R8B;
  bool bVar7;
  bool bVar8;
  
  uVar4 = (uint)(this->m_path)._M_string_length;
  bVar7 = 0 < (int)uVar4;
  if ((int)uVar4 < 1) {
LAB_00115f17:
    return (bool)(bVar7 & in_R8B);
  }
  pcVar3 = (this->m_path)._M_dataplus._M_p;
  uVar5 = (ulong)(uVar4 & 0x7fffffff);
  uVar6 = 1;
  do {
    cVar1 = pcVar3[uVar6 - 1];
    if ((cVar1 == ':') && (uVar6 < uVar5)) {
      cVar2 = pcVar3[uVar6];
      in_R8B = 1;
      if ((cVar2 == '/') || (cVar2 == '\\')) goto LAB_00115f17;
    }
    in_R8B = 0;
    if ((cVar1 == '/') || (cVar1 == '\\')) goto LAB_00115f17;
    bVar7 = uVar6 < uVar5;
    bVar8 = uVar6 == uVar5;
    uVar6 = uVar6 + 1;
    if (bVar8) goto LAB_00115f17;
  } while( true );
}

Assistant:

bool FilePath::beginsWithDrive (void) const
{
	for (int ndx = 0; ndx < (int)m_path.length(); ndx++)
	{
		if (m_path[ndx] == ':' && ndx+1 < (int)m_path.length() && isSeparator(m_path[ndx+1]))
			return true; // First part is drive letter.
		if (isSeparator(m_path[ndx]))
			return false;
	}
	return false;
}